

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O2

int __thiscall
GEO::geofile::translate_data(geofile *this,double *delta_x,double *delta_y,double *delta_z)

{
  geofile *pgVar1;
  geofile *this_00;
  geofile *pgVar2;
  _Self __tmp;
  bool local_29;
  
  local_29 = true;
  make_coherent(this,&local_29);
  this_00 = this;
  simplify_data(this);
  pgVar2 = (geofile *)(this->points_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pgVar2 != (geofile *)&(this->points_map)._M_t._M_impl.super__Rb_tree_header) {
    translate_point(this_00,(point *)&(pgVar2->points_map)._M_t._M_impl.super__Rb_tree_header.
                                      _M_header._M_parent,delta_x,delta_y,delta_z);
    pgVar1 = (geofile *)std::_Rb_tree_increment((_Rb_tree_node_base *)pgVar2);
    this_00 = pgVar2;
    pgVar2 = pgVar1;
  }
  return 0;
}

Assistant:

int GEO::geofile::translate_data(   const double &delta_x,
                                    const double &delta_y,
                                    const double &delta_z )
{
    make_coherent(true);
    simplify_data();
    auto end = points_map.end();
    for (auto i = points_map.begin(); i != end; i++)
    {
        translate_point(i->second, delta_x, delta_y, delta_z);
    }
    return EXIT_SUCCESS;
}